

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring64map.hh
# Opt level: O0

void __thiscall roaring::Roaring64Map::addRangeClosed(Roaring64Map *this,uint64_t min,uint64_t max)

{
  uint32_t uVar1;
  uint32_t uVar2;
  pointer ppVar3;
  uint64_t in_RDX;
  ulong in_RSI;
  undefined8 in_RDI;
  uint32_t unaff_retaddr;
  uint32_t unaff_retaddr_00;
  Roaring *bitmap;
  Roaring *next_intermediate;
  uint32_t i;
  Roaring *first_intermediate;
  Roaring *bitmap_2;
  uint32_t num_intermediate_bitmaps;
  Roaring *bitmap_1;
  iterator current_iter;
  uint32_t uint32_max;
  uint32_t end_low;
  uint32_t end_high;
  uint32_t start_low;
  uint32_t start_high;
  Roaring *in_stack_ffffffffffffff90;
  int local_5c;
  Roaring *r;
  Roaring *this_00;
  
  if (in_RSI <= in_RDX) {
    uVar1 = highBytes(in_RSI);
    lowBytes(in_RSI);
    uVar2 = highBytes(in_RDX);
    lowBytes(in_RDX);
    ensureRangePopulated((Roaring64Map *)bitmap,unaff_retaddr_00,unaff_retaddr);
    if (uVar1 == uVar2) {
      std::_Rb_tree_iterator<std::pair<const_unsigned_int,_roaring::Roaring>_>::operator->
                ((_Rb_tree_iterator<std::pair<const_unsigned_int,_roaring::Roaring>_> *)0x11ff27);
      Roaring::addRangeClosed
                (in_stack_ffffffffffffff90,(uint32_t)((ulong)in_RDI >> 0x20),(uint32_t)in_RDI);
    }
    else {
      ppVar3 = std::_Rb_tree_iterator<std::pair<const_unsigned_int,_roaring::Roaring>_>::operator->
                         ((_Rb_tree_iterator<std::pair<const_unsigned_int,_roaring::Roaring>_> *)
                          0x11ff60);
      this_00 = &ppVar3->second;
      Roaring::addRangeClosed
                (in_stack_ffffffffffffff90,(uint32_t)((ulong)in_RDI >> 0x20),(uint32_t)in_RDI);
      std::_Rb_tree_iterator<std::pair<const_unsigned_int,_roaring::Roaring>_>::operator++
                ((_Rb_tree_iterator<std::pair<const_unsigned_int,_roaring::Roaring>_> *)
                 in_stack_ffffffffffffff90);
      if (uVar2 - uVar1 != 1) {
        ppVar3 = std::_Rb_tree_iterator<std::pair<const_unsigned_int,_roaring::Roaring>_>::
                 operator->((_Rb_tree_iterator<std::pair<const_unsigned_int,_roaring::Roaring>_> *)
                            0x11ff97);
        r = &ppVar3->second;
        Roaring::addRangeClosed
                  (in_stack_ffffffffffffff90,(uint32_t)((ulong)in_RDI >> 0x20),(uint32_t)in_RDI);
        std::_Rb_tree_iterator<std::pair<const_unsigned_int,_roaring::Roaring>_>::operator++
                  ((_Rb_tree_iterator<std::pair<const_unsigned_int,_roaring::Roaring>_> *)
                   in_stack_ffffffffffffff90);
        for (local_5c = 1; local_5c != (uVar2 - uVar1) + -1; local_5c = local_5c + 1) {
          std::_Rb_tree_iterator<std::pair<const_unsigned_int,_roaring::Roaring>_>::operator->
                    ((_Rb_tree_iterator<std::pair<const_unsigned_int,_roaring::Roaring>_> *)0x11ffd7
                    );
          Roaring::operator=(this_00,r);
          std::_Rb_tree_iterator<std::pair<const_unsigned_int,_roaring::Roaring>_>::operator++
                    ((_Rb_tree_iterator<std::pair<const_unsigned_int,_roaring::Roaring>_> *)
                     in_stack_ffffffffffffff90);
        }
      }
      ppVar3 = std::_Rb_tree_iterator<std::pair<const_unsigned_int,_roaring::Roaring>_>::operator->
                         ((_Rb_tree_iterator<std::pair<const_unsigned_int,_roaring::Roaring>_> *)
                          0x120012);
      Roaring::addRangeClosed(&ppVar3->second,(uint32_t)((ulong)in_RDI >> 0x20),(uint32_t)in_RDI);
    }
  }
  return;
}

Assistant:

void addRangeClosed(uint64_t min, uint64_t max) {
        if (min > max) {
            return;
        }
        uint32_t start_high = highBytes(min);
        uint32_t start_low = lowBytes(min);
        uint32_t end_high = highBytes(max);
        uint32_t end_low = lowBytes(max);

        // We put std::numeric_limits<>::max in parentheses to avoid a
        // clash with the Windows.h header under Windows.
        const uint32_t uint32_max = (std::numeric_limits<uint32_t>::max)();

        // Fill in any nonexistent slots with empty Roarings. This simplifies
        // the logic below, allowing it to simply iterate over the map between
        // 'start_high' and 'end_high' in a linear fashion.
        auto current_iter = ensureRangePopulated(start_high, end_high);

        // If start and end land on the same inner bitmap, then we can do the
        // whole operation in one call.
        if (start_high == end_high) {
            auto &bitmap = current_iter->second;
            bitmap.addRangeClosed(start_low, end_low);
            return;
        }

        // Because start and end don't land on the same inner bitmap,
        // we need to do this in multiple steps:
        // 1. Partially fill the first bitmap with values from the closed
        //    interval [start_low, uint32_max]
        // 2. Fill intermediate bitmaps completely: [0, uint32_max]
        // 3. Partially fill the last bitmap with values from the closed
        //    interval [0, end_low]
        auto num_intermediate_bitmaps = end_high - start_high - 1;

        // Step 1: Partially fill the first bitmap.
        {
            auto &bitmap = current_iter->second;
            bitmap.addRangeClosed(start_low, uint32_max);
            ++current_iter;
        }

        // Step 2. Fill intermediate bitmaps completely.
        if (num_intermediate_bitmaps != 0) {
            auto &first_intermediate = current_iter->second;
            first_intermediate.addRangeClosed(0, uint32_max);
            ++current_iter;

            // Now make (num_intermediate_bitmaps - 1) copies of this.
            for (uint32_t i = 1; i != num_intermediate_bitmaps; ++i) {
                auto &next_intermediate = current_iter->second;
                next_intermediate = first_intermediate;
                ++current_iter;
            }
        }

        // Step 3: Partially fill the last bitmap.
        auto &bitmap = current_iter->second;
        bitmap.addRangeClosed(0, end_low);
    }